

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O2

Result __thiscall wabt::anon_unknown_15::BinaryReaderIR::OnEndExpr(BinaryReaderIR *this)

{
  Result RVar1;
  TryExpr *pTVar2;
  IfExpr *pIVar3;
  Expr *expr;
  LabelNode *label;
  Location local_30;
  
  if ((ulong)(((long)(this->label_stack_).
                     super__Vector_base<wabt::(anonymous_namespace)::LabelNode,_std::allocator<wabt::(anonymous_namespace)::LabelNode>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->label_stack_).
                    super__Vector_base<wabt::(anonymous_namespace)::LabelNode,_std::allocator<wabt::(anonymous_namespace)::LabelNode>_>
                    ._M_impl.super__Vector_impl_data._M_start) / 0x18) < 2)
  goto switchD_00117c6d_default;
  RVar1 = TopLabelExpr(this,&label,&expr);
  if (RVar1.enum_ == Error) {
    return (Result)Error;
  }
  switch(label->label_type) {
  case Block:
    GetLocation(&local_30,this);
    pTVar2 = (TryExpr *)cast<wabt::BlockExprBase<(wabt::ExprType)8>,wabt::Expr>(expr);
    break;
  case Loop:
    GetLocation(&local_30,this);
    pTVar2 = (TryExpr *)cast<wabt::BlockExprBase<(wabt::ExprType)27>,wabt::Expr>(expr);
    break;
  case If:
    GetLocation(&local_30,this);
    pTVar2 = (TryExpr *)cast<wabt::IfExpr,wabt::Expr>(expr);
    break;
  case Else:
    GetLocation(&local_30,this);
    pIVar3 = cast<wabt::IfExpr,wabt::Expr>(expr);
    (pIVar3->false_end_loc).filename._M_len = local_30.filename._M_len;
    (pIVar3->false_end_loc).filename._M_str = local_30.filename._M_str;
    (pIVar3->false_end_loc).field_1.field_1.offset = (size_t)local_30.field_1.field_1.offset;
    *(undefined8 *)((long)&(pIVar3->false_end_loc).field_1 + 8) = local_30.field_1._8_8_;
    goto switchD_00117c6d_default;
  case Try:
    GetLocation(&local_30,this);
    pTVar2 = cast<wabt::TryExpr,wabt::Expr>(expr);
    break;
  default:
    goto switchD_00117c6d_default;
  }
  (pTVar2->block).end_loc.filename._M_len = local_30.filename._M_len;
  (pTVar2->block).end_loc.filename._M_str = local_30.filename._M_str;
  (pTVar2->block).end_loc.field_1.field_1.offset = (size_t)local_30.field_1.field_1.offset;
  *(undefined8 *)((long)&(pTVar2->block).end_loc.field_1 + 8) = local_30.field_1._8_8_;
switchD_00117c6d_default:
  RVar1 = PopLabel(this);
  return (Result)RVar1.enum_;
}

Assistant:

Result BinaryReaderIR::OnEndExpr() {
  if (label_stack_.size() > 1) {
    LabelNode* label;
    Expr* expr;
    CHECK_RESULT(TopLabelExpr(&label, &expr));
    switch (label->label_type) {
      case LabelType::Block:
        cast<BlockExpr>(expr)->block.end_loc = GetLocation();
        break;
      case LabelType::Loop:
        cast<LoopExpr>(expr)->block.end_loc = GetLocation();
        break;
      case LabelType::If:
        cast<IfExpr>(expr)->true_.end_loc = GetLocation();
        break;
      case LabelType::Else:
        cast<IfExpr>(expr)->false_end_loc = GetLocation();
        break;
      case LabelType::Try:
        cast<TryExpr>(expr)->block.end_loc = GetLocation();
        break;

      case LabelType::InitExpr:
      case LabelType::Func:
      case LabelType::Catch:
        break;
    }
  }

  return PopLabel();
}